

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_corofile.cpp
# Opt level: O3

void create_file(string *filename,size_t file_size,
                vector<char,_std::allocator<char>_> *fill_with_vec)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ofstream file;
  long local_228;
  filebuf local_220 [20];
  undefined4 uStack_20c;
  byte abStack_208 [216];
  ios_base local_130 [264];
  
  std::ofstream::ofstream(&local_228,(string *)filename,_S_bin);
  lVar2 = *(long *)(local_228 + -0x18);
  *(undefined4 *)((long)&uStack_20c + lVar2) = 5;
  std::ios::clear((int)&local_228 + (int)lVar2);
  if ((abStack_208[*(long *)(local_228 + -0x18)] & 5) == 0) {
    if ((file_size != 0) &&
       ((fill_with_vec->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (fill_with_vec->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_start)) {
      lVar2 = (long)(int)(file_size >> 0xc);
      if ((file_size >> 0xc & 0xffffffff) != 0) {
        lVar3 = lVar2 + (ulong)(lVar2 == 0);
        do {
          std::ostream::write((char *)&local_228,
                              (long)(fill_with_vec->super__Vector_base<char,_std::allocator<char>_>)
                                    ._M_impl.super__Vector_impl_data._M_start);
          lVar3 = lVar3 + -1;
        } while (lVar3 != 0);
      }
      iVar1 = (int)(lVar2 << 0xc);
      if ((int)file_size != iVar1 && -1 < (int)file_size - iVar1) {
        std::ostream::write((char *)&local_228,
                            (long)(fill_with_vec->super__Vector_base<char,_std::allocator<char>_>).
                                  _M_impl.super__Vector_impl_data._M_start);
      }
      std::ostream::flush();
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"create file failed\n",0x13);
  }
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _timerfd_settime;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void create_file(std::string filename, size_t file_size,
                 const std::vector<char> &fill_with_vec) {
  std::ofstream file(filename, std::ios::binary);
  file.exceptions(std::ios_base::failbit | std::ios_base::badbit);

  if (!file) {
    std::cout << "create file failed\n";
    return;
  }
  size_t fill_with_size = fill_with_vec.size();
  if (file_size == 0 || fill_with_size == 0) {
    return;
  }
  int cnt = file_size / block_size;
  int remain = file_size - block_size * cnt;
  for (size_t i = 0; i < cnt; i++) {
    file.write(fill_with_vec.data(), block_size);
  }
  if (remain > 0) {
    file.write(fill_with_vec.data(), remain);
  }
  file.flush();  // can throw
  return;
}